

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::ArenaTest_RepeatedPtrFieldMoveCtorOnArena_Test::TestBody
          (ArenaTest_RepeatedPtrFieldMoveCtorOnArena_Test *this)

{
  bool bVar1;
  char *pcVar2;
  RepeatedPtrField<proto2_unittest::TestAllTypes> *this_00;
  uint64_t uVar3;
  const_reference message;
  AssertHelper local_1c0;
  Message local_1b8;
  int local_1b0;
  int local_1ac;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_4;
  Message local_190;
  unsigned_long local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_3;
  Message local_168;
  unsigned_long local_160;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_2;
  Message local_140;
  int local_138;
  int local_134;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_1;
  uint64_t usage_by_move;
  RepeatedPtrField<proto2_unittest::TestAllTypes> *moved;
  uint64_t usage_original;
  TestAllTypes *msg;
  RepeatedPtrField<proto2_unittest::TestAllTypes> *original;
  AssertHelper local_f0;
  Message local_e8;
  int local_e0 [4];
  uint64_t local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  Arena arena;
  ArenaTest_RepeatedPtrFieldMoveCtorOnArena_Test *this_local;
  
  Arena::Arena((Arena *)&gtest_ar.message_);
  local_d0 = Arena::SpaceUsed((Arena *)&gtest_ar.message_);
  local_e0[0] = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_c8,"arena.SpaceUsed()","0",&local_d0,local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x1d5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::Message::~Message(&local_e8);
  }
  original._4_4_ = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  if (original._4_4_ == 0) {
    msg = (TestAllTypes *)
          Arena::Create<google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypes>>
                    ((Arena *)&gtest_ar.message_);
    usage_original =
         (uint64_t)
         RepeatedPtrField<proto2_unittest::TestAllTypes>::Add
                   ((RepeatedPtrField<proto2_unittest::TestAllTypes> *)msg);
    TestUtil::SetAllFields<proto2_unittest::TestAllTypes>((TestAllTypes *)usage_original);
    TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>((TestAllTypes *)usage_original);
    moved = (RepeatedPtrField<proto2_unittest::TestAllTypes> *)
            Arena::SpaceUsed((Arena *)&gtest_ar.message_);
    this_00 = Arena::
              Create<google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypes>,google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypes>>
                        ((Arena *)&gtest_ar.message_,
                         (RepeatedPtrField<proto2_unittest::TestAllTypes> *)msg);
    uVar3 = Arena::SpaceUsed((Arena *)&gtest_ar.message_);
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(uVar3 - (long)moved);
    local_134 = RepeatedPtrField<proto2_unittest::TestAllTypes>::size(this_00);
    local_138 = 1;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_130,"moved->size()","1",&local_134,&local_138);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
    if (!bVar1) {
      testing::Message::Message(&local_140);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                 ,0x1e1,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_140);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_140);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
    message = RepeatedPtrField<proto2_unittest::TestAllTypes>::Get(this_00,0);
    TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(message);
    local_160 = 0x18;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_158,"usage_by_move","sizeof(internal::RepeatedPtrFieldBase)",
               (unsigned_long *)&gtest_ar_1.message_,&local_160);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
    if (!bVar1) {
      testing::Message::Message(&local_168);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                 ,0x1e5,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_168);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_168);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
    local_188 = (long)gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl + 0x340;
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              ((internal *)local_180,"usage_by_move + sizeof(TestAllTypes)","usage_original",
               &local_188,(unsigned_long *)&moved);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
    if (!bVar1) {
      testing::Message::Message(&local_190);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                 ,0x1e6,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_190);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_190);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
    local_1ac = RepeatedPtrField<proto2_unittest::TestAllTypes>::size
                          ((RepeatedPtrField<proto2_unittest::TestAllTypes> *)msg);
    local_1b0 = 0;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_1a8,"original->size()","0",&local_1ac,&local_1b0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
    if (!bVar1) {
      testing::Message::Message(&local_1b8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                 ,0x1ea,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      testing::Message::~Message(&local_1b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
    original._4_4_ = 0;
  }
  Arena::~Arena((Arena *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(ArenaTest, RepeatedPtrFieldMoveCtorOnArena) {
  Arena arena;

  ASSERT_EQ(arena.SpaceUsed(), 0);

  auto* original = Arena::Create<RepeatedPtrField<TestAllTypes>>(&arena);
  auto* msg = original->Add();
  TestUtil::SetAllFields(msg);
  TestUtil::ExpectAllFieldsSet(*msg);

  auto usage_original = arena.SpaceUsed();
  auto* moved = Arena::Create<RepeatedPtrField<TestAllTypes>>(
      &arena, std::move(*original));
  auto usage_by_move = arena.SpaceUsed() - usage_original;

  EXPECT_EQ(moved->size(), 1);
  TestUtil::ExpectAllFieldsSet(moved->Get(0));

  // The only extra allocation with moves is sizeof(RepeatedPtrField).
  EXPECT_EQ(usage_by_move, sizeof(internal::RepeatedPtrFieldBase));
  EXPECT_LT(usage_by_move + sizeof(TestAllTypes), usage_original);

  // Status after move is unspecified and must not be assumed. It's merely
  // checking current implementation specifics for protobuf internal.
  EXPECT_EQ(original->size(), 0);
}